

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void TPZCompElHCurl<pzshape::TPZShapePrism>::TransformCurl<1>
               (TPZFMatrix<double> *curlphiref,REAL detjac,TPZFMatrix<double> *jacobian,
               TPZFMatrix<double> *curlphi)

{
  long *in_RDX;
  TPZFMatrix<double> *in_RDI;
  TPZFMatrix<double> *in_XMM0_Qa;
  
  TPZFMatrix<double>::operator=(in_RDI,in_XMM0_Qa);
  (**(code **)(*in_RDX + 0x130))(1.0 / (double)in_XMM0_Qa);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::TransformCurl(const TPZFMatrix<REAL> &curlphiref,
                                           const REAL detjac,
                                           const TPZFMatrix<REAL> &jacobian,
                                           TPZFMatrix<REAL> &curlphi)
{
    if constexpr(TDIM==3){
        curlphi = jacobian * curlphiref;
        curlphi *= 1./detjac;
    }else {
        curlphi = curlphiref;
        curlphi *= 1./detjac;
    }
}